

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O1

int matchbracketclass(int c,char *p,char *ec)

{
  byte bVar1;
  bool bVar2;
  byte *pbVar3;
  int iVar4;
  byte *pbVar5;
  bool bVar6;
  bool bVar7;
  
  bVar7 = p[1] == '^';
  bVar2 = !bVar7;
  pbVar5 = (byte *)(p + 1);
  if (!bVar7) {
    pbVar5 = (byte *)p;
  }
  do {
    while( true ) {
      while( true ) {
        pbVar3 = pbVar5 + 1;
        bVar6 = bVar7;
        if (ec <= pbVar3) goto LAB_0012c107;
        bVar1 = pbVar5[1];
        bVar6 = bVar2;
        if (bVar1 != 0x25) break;
        iVar4 = match_class(c,(uint)pbVar5[2]);
        if (iVar4 != 0) goto LAB_0012c107;
        pbVar5 = pbVar5 + 2;
      }
      if ((pbVar5[2] != 0x2d) || (pbVar5 = pbVar5 + 3, ec <= pbVar5)) break;
      if (((int)(uint)bVar1 <= c) && (c <= (int)(uint)*pbVar5)) goto LAB_0012c107;
    }
    pbVar5 = pbVar3;
  } while ((uint)bVar1 != c);
LAB_0012c107:
  return (int)bVar6;
}

Assistant:

static int matchbracketclass (int c, const char *p, const char *ec) {
  int sig = 1;
  if (*(p+1) == '^') {
    sig = 0;
    p++;  /* skip the '^' */
  }
  while (++p < ec) {
    if (*p == L_ESC) {
      p++;
      if (match_class(c, uchar(*p)))
        return sig;
    }
    else if ((*(p+1) == '-') && (p+2 < ec)) {
      p+=2;
      if (uchar(*(p-2)) <= c && c <= uchar(*p))
        return sig;
    }
    else if (uchar(*p) == c) return sig;
  }
  return !sig;
}